

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_scalar_split(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  secp256k1_scalar *in_RDI;
  secp256k1_scalar *unaff_retaddr;
  secp256k1_scalar tmp;
  bench_inv *data;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  int iVar3;
  secp256k1_scalar *r2;
  
  iVar2 = 0;
  r2 = in_RDI;
  for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
    secp256k1_scalar_split_lambda(unaff_retaddr,r2,(secp256k1_scalar *)CONCAT44(in_ESI,iVar3));
    iVar1 = secp256k1_scalar_add
                      ((secp256k1_scalar *)CONCAT44(in_ESI,iVar3),
                       (secp256k1_scalar *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_RDI);
    iVar2 = iVar1 + iVar2;
  }
  if (in_ESI < iVar2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench_internal.c"
            ,0x96,"test condition failed: j <= iters");
    abort();
  }
  return;
}

Assistant:

static void bench_scalar_split(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_scalar tmp;

    for (i = 0; i < iters; i++) {
        secp256k1_scalar_split_lambda(&tmp, &data->scalar[1], &data->scalar[0]);
        j += secp256k1_scalar_add(&data->scalar[0], &tmp, &data->scalar[1]);
    }
    CHECK(j <= iters);
}